

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void icu_63::initCalendarService(UErrorCode *status)

{
  ICULocaleService *this;
  BasicCalendarFactory *this_00;
  code *size;
  
  size = calendar_cleanup;
  ucln_i18n_registerCleanup_63(UCLN_I18N_CALENDAR,calendar_cleanup);
  this = (ICULocaleService *)UMemory::operator_new((UMemory *)0x198,(size_t)size);
  if (this == (ICULocaleService *)0x0) {
    gService = (ICULocaleService *)0x0;
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    CalendarService::CalendarService((CalendarService *)this);
    gService = this;
    this_00 = (BasicCalendarFactory *)UMemory::operator_new((UMemory *)0x50,(size_t)size);
    if (this_00 != (BasicCalendarFactory *)0x0) {
      BasicCalendarFactory::BasicCalendarFactory(this_00);
    }
    (*(this->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[9])(this,this_00,status);
    if (U_ZERO_ERROR < *status) {
      if (gService != (ICULocaleService *)0x0) {
        (*(gService->super_ICUService).super_ICUNotifier._vptr_ICUNotifier[1])();
      }
      gService = (ICULocaleService *)0x0;
    }
  }
  return;
}

Assistant:

static void U_CALLCONV
initCalendarService(UErrorCode &status)
{
#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "Spinning up Calendar Service\n");
#endif
    ucln_i18n_registerCleanup(UCLN_I18N_CALENDAR, calendar_cleanup);
    gService = new CalendarService();
    if (gService == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
        return;
        }
#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "Registering classes..\n");
#endif

        // Register all basic instances.
    gService->registerFactory(new BasicCalendarFactory(),status);

#ifdef U_DEBUG_CALSVC
        fprintf(stderr, "Done..\n");
#endif

        if(U_FAILURE(status)) {
#ifdef U_DEBUG_CALSVC
            fprintf(stderr, "err (%s) registering classes, deleting service.....\n", u_errorName(status));
#endif
        delete gService;
        gService = NULL;
    }
        }